

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h
# Opt level: O2

int __thiscall
TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoPrism>_>::ClassId
          (TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoPrism>_> *this)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  allocator<char> local_1bf9;
  string local_1bf8;
  TPZGeoBlend<pzgeom::TPZGeoPrism> local_1bd8;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1bf8,"TPZGeoElRefLess",&local_1bf9);
  uVar1 = Hash(&local_1bf8);
  iVar2 = TPZGeoEl::ClassId(&this->super_TPZGeoEl);
  pzgeom::TPZGeoBlend<pzgeom::TPZGeoPrism>::TPZGeoBlend(&local_1bd8);
  iVar3 = pzgeom::TPZGeoBlend<pzgeom::TPZGeoPrism>::ClassId(&local_1bd8);
  pzgeom::TPZGeoBlend<pzgeom::TPZGeoPrism>::~TPZGeoBlend(&local_1bd8);
  std::__cxx11::string::~string((string *)&local_1bf8);
  return iVar3 << 2 ^ iVar2 * 2 ^ uVar1;
}

Assistant:

int TPZGeoElRefLess<TGeo>::ClassId() const{
    return Hash("TPZGeoElRefLess") ^ TPZGeoEl::ClassId() << 1 ^ TGeo().ClassId() << 2;
}